

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O0

void __thiscall mjs::gc_heap::pointer_set::insert(pointer_set *this,gc_heap_ptr_untyped *p)

{
  uint uVar1;
  uint32_t cap;
  gc_heap_ptr_untyped **__dest;
  gc_heap_ptr_untyped **n;
  uint32_t new_cap;
  gc_heap_ptr_untyped *p_local;
  pointer_set *this_local;
  
  if (this->size_ == this->capacity_) {
    cap = this->capacity_ << 1;
    __dest = alloc(cap);
    memcpy(__dest,this->set_,(ulong)this->size_ << 3);
    free(this->set_);
    this->set_ = __dest;
    this->capacity_ = cap;
  }
  uVar1 = this->size_;
  this->size_ = uVar1 + 1;
  this->set_[uVar1] = p;
  return;
}

Assistant:

void insert(gc_heap_ptr_untyped& p) {
            // Note: garbage_collect() assumes nodes are added to the back
            // assert(std::find(begin(), end(), &p) == end()); // Other asserts should catch this
            if (size_ == capacity_) {
                const auto new_cap = capacity_ * 2;
                auto n = alloc(new_cap);
                std::memcpy(n, set_, size_*sizeof(gc_heap_ptr_untyped*));
                std::free(set_);
                set_ = n;
                capacity_ = new_cap;
            }
            set_[size_++] = &p;
        }